

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irStatement * build_ir_ifstmt(Context_conflict *ctx,MOJOSHADER_astIfStatement *ast)

{
  int iVar1;
  int iVar2;
  int label;
  MOJOSHADER_irExpression *pMVar3;
  MOJOSHADER_irExpression *pMVar4;
  MOJOSHADER_irStatement *pMVar5;
  MOJOSHADER_irStatement *pMVar6;
  MOJOSHADER_irStatement *pMVar7;
  MOJOSHADER_irStatement *pMVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_irStatement *pMVar10;
  MOJOSHADER_irStatement *pMVar11;
  MOJOSHADER_irStatement *next;
  int join;
  int f;
  int t;
  int join_1;
  int t_1;
  MOJOSHADER_astIfStatement *ast_local;
  Context_conflict *ctx_local;
  
  if (ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL) {
    if (ast->else_statement == (MOJOSHADER_astStatement *)0x0) {
      iVar1 = generate_ir_label(ctx);
      iVar2 = generate_ir_label(ctx);
      pMVar3 = build_ir_expr(ctx,ast->expr);
      pMVar4 = new_ir_constbool(ctx,1);
      pMVar5 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,pMVar3,pMVar4,iVar1,iVar2);
      pMVar6 = new_ir_label(ctx,iVar1);
      pMVar7 = build_ir_stmt(ctx,ast->statement);
      pMVar8 = new_ir_label(ctx,iVar2);
      pMVar9 = build_ir_stmt(ctx,ast->next);
      pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
      pMVar7 = new_ir_seq(ctx,pMVar7,pMVar8);
      pMVar6 = new_ir_seq(ctx,pMVar6,pMVar7);
      ctx_local = (Context_conflict *)new_ir_seq(ctx,pMVar5,pMVar6);
    }
    else {
      iVar1 = generate_ir_label(ctx);
      iVar2 = generate_ir_label(ctx);
      label = generate_ir_label(ctx);
      pMVar3 = build_ir_expr(ctx,ast->expr);
      pMVar4 = new_ir_constbool(ctx,1);
      pMVar5 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,pMVar3,pMVar4,iVar1,iVar2);
      pMVar6 = new_ir_label(ctx,iVar1);
      pMVar7 = build_ir_stmt(ctx,ast->statement);
      pMVar8 = new_ir_jump(ctx,label);
      pMVar9 = new_ir_label(ctx,iVar2);
      pMVar10 = build_ir_stmt(ctx,ast->else_statement);
      pMVar11 = new_ir_label(ctx,label);
      next = build_ir_stmt(ctx,ast->next);
      pMVar11 = new_ir_seq(ctx,pMVar11,next);
      pMVar10 = new_ir_seq(ctx,pMVar10,pMVar11);
      pMVar9 = new_ir_seq(ctx,pMVar9,pMVar10);
      pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
      pMVar7 = new_ir_seq(ctx,pMVar7,pMVar8);
      pMVar6 = new_ir_seq(ctx,pMVar6,pMVar7);
      ctx_local = (Context_conflict *)new_ir_seq(ctx,pMVar5,pMVar6);
    }
    return (MOJOSHADER_irStatement *)ctx_local;
  }
  __assert_fail("ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x133f,
                "MOJOSHADER_irStatement *build_ir_ifstmt(Context *, const MOJOSHADER_astIfStatement *)"
               );
}

Assistant:

static MOJOSHADER_irStatement *build_ir_ifstmt(Context *ctx,
                                          const MOJOSHADER_astIfStatement *ast)
{
    assert(ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);

    // !!! FIXME: ast->attributes?

    // IF statement without an ELSE.
    if (ast->else_statement == NULL)
    {
        /* The gist...
                cjump expr, t, join
            t:
                statement
            join:
        */

        const int t = generate_ir_label(ctx);
        const int join = generate_ir_label(ctx);

        return new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->expr), new_ir_constbool(ctx, 1), t, join),
               new_ir_seq(ctx, new_ir_label(ctx, t),
               new_ir_seq(ctx, build_ir_stmt(ctx, ast->statement),
               new_ir_seq(ctx, new_ir_label(ctx, join),
                               build_ir_stmt(ctx, ast->next)))));
    } // if

    // IF statement _with_ an ELSE.
    /* The gist...
            cjump expr, t, f
        t:
            statement
            jump join
        f:
            elsestatement
        join:
    */

    const int t = generate_ir_label(ctx);
    const int f = generate_ir_label(ctx);
    const int join = generate_ir_label(ctx);

    return new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->expr), new_ir_constbool(ctx, 1), t, f),
           new_ir_seq(ctx, new_ir_label(ctx, t),
           new_ir_seq(ctx, build_ir_stmt(ctx, ast->statement),
           new_ir_seq(ctx, new_ir_jump(ctx, join),
           new_ir_seq(ctx, new_ir_label(ctx, f),
           new_ir_seq(ctx, build_ir_stmt(ctx, ast->else_statement),
           new_ir_seq(ctx, new_ir_label(ctx, join),
                           build_ir_stmt(ctx, ast->next))))))));
}